

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmLocalGenerator *parent,Snapshot snapshot)

{
  bool bVar1;
  cmMakefile *this_00;
  cmLocalGenerator *parent_local;
  cmGlobalGenerator *gg_local;
  cmLocalGenerator *this_local;
  
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,snapshot);
  this->_vptr_cmLocalGenerator = (_func_int **)&PTR__cmLocalGenerator_00af2250;
  (this->StateSnapshot).Position.Position = snapshot.Position.Position;
  (this->StateSnapshot).State = snapshot.State;
  (this->StateSnapshot).Position.Tree = snapshot.Position.Tree;
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::vector(&this->Children);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->UniqueObjectNamesMap);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ObjectMaxPathViolations);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            (&this->WarnCMP0063);
  std::__cxx11::string::string((string *)&this->TargetImplib);
  bVar1 = cmState::Snapshot::IsValid(&snapshot);
  if (!bVar1) {
    __assert_fail("snapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0x33,
                  "cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator *, cmLocalGenerator *, cmState::Snapshot)"
                 );
  }
  this->GlobalGenerator = gg;
  this->Parent = parent;
  if (parent != (cmLocalGenerator *)0x0) {
    AddChild(parent,this);
  }
  this_00 = (cmMakefile *)operator_new(0x870);
  cmMakefile::cmMakefile(this_00,this);
  this->Makefile = this_00;
  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
  return;
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg,
                                   cmLocalGenerator* parent,
                                   cmState::Snapshot snapshot)
  : cmOutputConverter(snapshot), StateSnapshot(snapshot)
{
  assert(snapshot.IsValid());
  this->GlobalGenerator = gg;
  this->Parent = parent;
  if (parent)
    {
    parent->AddChild(this);
    }

  this->Makefile = new cmMakefile(this);

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
}